

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct4x4_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int in_ECX;
  int in_EDX;
  __m128i *in_RSI;
  undefined1 (*in_RDI) [16];
  __m128i *in_R8;
  int in_R9D;
  undefined4 in_register_0000008c;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  __m128i in1;
  __m128i in1_00;
  __m128i in0;
  __m128i in0_00;
  __m128i y;
  __m128i x;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  __m128i v0;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i rnding;
  __m128i cospim16;
  __m128i cospi16;
  __m128i cospi48;
  __m128i cospi32;
  int32_t *cospi;
  __m128i *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  int iVar21;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  longlong local_438;
  longlong lStack_430;
  longlong local_428;
  longlong lStack_420;
  int local_40c;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  int32_t *local_3b8;
  int local_3b0;
  int local_3ac;
  int local_3a8;
  int local_3a4;
  __m128i *local_3a0;
  undefined1 (*local_398) [16];
  int local_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  int local_36c;
  undefined8 local_368;
  undefined8 uStack_360;
  int local_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  int local_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  int local_20c;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int32_t local_1f4;
  int32_t local_1f0;
  int32_t local_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  int32_t local_118;
  int32_t local_114;
  int32_t local_110;
  int32_t local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  int32_t local_f8;
  int32_t local_f4;
  int32_t local_f0;
  int32_t local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int32_t local_d8;
  int32_t local_d4;
  int32_t local_d0;
  int32_t local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  longlong local_88;
  longlong lStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  longlong local_68;
  longlong lStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  longlong local_48;
  longlong lStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  longlong local_28;
  longlong lStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_3ac = (int)in_R8;
  local_3b0 = in_R9D;
  local_3a8 = in_ECX;
  local_3a4 = in_EDX;
  local_3a0 = in_RSI;
  local_398 = in_RDI;
  local_3b8 = cospi_arr(in_EDX);
  local_1ec = local_3b8[0x20];
  local_3c8 = CONCAT44(local_1ec,local_1ec);
  uStack_3c0 = CONCAT44(local_1ec,local_1ec);
  local_1f0 = local_3b8[0x30];
  local_3d8 = CONCAT44(local_1f0,local_1f0);
  uStack_3d0 = CONCAT44(local_1f0,local_1f0);
  local_1f4 = local_3b8[0x10];
  local_3e8 = CONCAT44(local_1f4,local_1f4);
  uStack_3e0 = CONCAT44(local_1f4,local_1f4);
  local_1f8 = -local_3b8[0x10];
  local_3f8 = CONCAT44(local_1f8,local_1f8);
  uStack_3f0 = CONCAT44(local_1f8,local_1f8);
  local_1fc = 1 << ((char)local_3a4 - 1U & 0x1f);
  local_408 = CONCAT44(local_1fc,local_1fc);
  uStack_400 = CONCAT44(local_1fc,local_1fc);
  iVar21 = 8;
  if (local_3a8 != 0) {
    iVar21 = 6;
  }
  if (local_3ac + iVar21 < 0x10) {
    iVar21 = 0x10;
  }
  else {
    iVar21 = 8;
    if (local_3a8 != 0) {
      iVar21 = 6;
    }
    iVar21 = local_3ac + iVar21;
  }
  local_40c._0_1_ = (char)iVar21;
  local_200 = -(1 << ((char)local_40c - 1U & 0x1f));
  local_428 = CONCAT44(local_200,local_200);
  lStack_420 = CONCAT44(local_200,local_200);
  local_204 = (1 << ((char)local_40c - 1U & 0x1f)) + -1;
  local_438 = CONCAT44(local_204,local_204);
  lStack_430 = CONCAT44(local_204,local_204);
  local_138 = *(undefined8 *)*local_398;
  uStack_130 = *(undefined8 *)(*local_398 + 8);
  pauVar1 = local_398 + 1;
  local_1b8 = *(undefined8 *)*pauVar1;
  uStack_1b0 = *(undefined8 *)(local_398[1] + 8);
  local_158 = *(undefined8 *)local_398[2];
  uStack_150 = *(undefined8 *)(local_398[2] + 8);
  pauVar2 = local_398 + 3;
  local_1d8 = *(undefined8 *)*pauVar2;
  uStack_1d0 = *(undefined8 *)(local_398[3] + 8);
  auVar6._8_8_ = uStack_3c0;
  auVar6._0_8_ = local_3c8;
  auVar19 = pmulld(*local_398,auVar6);
  auVar5._8_8_ = uStack_3c0;
  auVar5._0_8_ = local_3c8;
  auVar20 = pmulld(local_398[2],auVar5);
  local_4c8 = auVar19._0_8_;
  uStack_4c0 = auVar19._8_8_;
  local_4d8 = auVar20._0_8_;
  uStack_4d0 = auVar20._8_8_;
  local_248 = local_4c8;
  uVar17 = local_248;
  uStack_240 = uStack_4c0;
  uVar18 = uStack_240;
  local_258 = local_4d8;
  uVar15 = local_258;
  uStack_250 = uStack_4d0;
  uVar16 = uStack_250;
  local_248._0_4_ = auVar19._0_4_;
  local_248._4_4_ = auVar19._4_4_;
  uStack_240._0_4_ = auVar19._8_4_;
  uStack_240._4_4_ = auVar19._12_4_;
  local_258._0_4_ = auVar20._0_4_;
  local_258._4_4_ = auVar20._4_4_;
  uStack_250._0_4_ = auVar20._8_4_;
  uStack_250._4_4_ = auVar20._12_4_;
  local_268 = CONCAT44(local_248._4_4_ + local_258._4_4_,(int)local_248 + (int)local_258);
  uStack_260 = CONCAT44(uStack_240._4_4_ + uStack_250._4_4_,(int)uStack_240 + (int)uStack_250);
  local_328 = CONCAT44(local_248._4_4_ + local_258._4_4_ + local_1fc,
                       (int)local_248 + (int)local_258 + local_1fc);
  uStack_320 = CONCAT44(uStack_240._4_4_ + uStack_250._4_4_ + local_1fc,
                        (int)uStack_240 + (int)uStack_250 + local_1fc);
  local_32c = local_3a4;
  local_228 = local_4c8;
  uStack_220 = uStack_4c0;
  local_238 = local_4d8;
  uStack_230 = uStack_4d0;
  local_288 = CONCAT44(local_248._4_4_ - local_258._4_4_,(int)local_248 - (int)local_258);
  uStack_280 = CONCAT44(uStack_240._4_4_ - uStack_250._4_4_,(int)uStack_240 - (int)uStack_250);
  local_348 = CONCAT44((local_248._4_4_ - local_258._4_4_) + local_1fc,
                       ((int)local_248 - (int)local_258) + local_1fc);
  uStack_340 = CONCAT44((uStack_240._4_4_ - uStack_250._4_4_) + local_1fc,
                        ((int)uStack_240 - (int)uStack_250) + local_1fc);
  local_34c = local_3a4;
  auVar4._8_8_ = uStack_3d0;
  auVar4._0_8_ = local_3d8;
  auVar19 = pmulld(*pauVar1,auVar4);
  auVar3._8_8_ = uStack_3f0;
  auVar3._0_8_ = local_3f8;
  auVar20 = pmulld(*pauVar2,auVar3);
  local_4c8 = auVar19._0_8_;
  uStack_4c0 = auVar19._8_8_;
  local_4d8 = auVar20._0_8_;
  uStack_4d0 = auVar20._8_8_;
  local_2a8 = local_4c8;
  uVar13 = local_2a8;
  uStack_2a0 = uStack_4c0;
  uVar14 = uStack_2a0;
  local_2b8 = local_4d8;
  uVar11 = local_2b8;
  uStack_2b0 = uStack_4d0;
  uVar12 = uStack_2b0;
  local_2a8._0_4_ = auVar19._0_4_;
  local_2a8._4_4_ = auVar19._4_4_;
  uStack_2a0._0_4_ = auVar19._8_4_;
  uStack_2a0._4_4_ = auVar19._12_4_;
  local_2b8._0_4_ = auVar20._0_4_;
  local_2b8._4_4_ = auVar20._4_4_;
  uStack_2b0._0_4_ = auVar20._8_4_;
  uStack_2b0._4_4_ = auVar20._12_4_;
  local_2c8 = CONCAT44(local_2a8._4_4_ + local_2b8._4_4_,(int)local_2a8 + (int)local_2b8);
  uStack_2c0 = CONCAT44(uStack_2a0._4_4_ + uStack_2b0._4_4_,(int)uStack_2a0 + (int)uStack_2b0);
  local_368 = CONCAT44(local_2a8._4_4_ + local_2b8._4_4_ + local_1fc,
                       (int)local_2a8 + (int)local_2b8 + local_1fc);
  uStack_360 = CONCAT44(uStack_2a0._4_4_ + uStack_2b0._4_4_ + local_1fc,
                        (int)uStack_2a0 + (int)uStack_2b0 + local_1fc);
  local_36c = local_3a4;
  auVar20._8_8_ = uStack_3e0;
  auVar20._0_8_ = local_3e8;
  auVar20 = pmulld(*pauVar1,auVar20);
  auVar19._8_8_ = uStack_3d0;
  auVar19._0_8_ = local_3d8;
  auVar19 = pmulld(*pauVar2,auVar19);
  local_4c8 = auVar20._0_8_;
  uStack_4c0 = auVar20._8_8_;
  local_4d8 = auVar19._0_8_;
  uStack_4d0 = auVar19._8_8_;
  local_2e8 = local_4c8;
  uVar9 = local_2e8;
  uStack_2e0 = uStack_4c0;
  uVar10 = uStack_2e0;
  local_2f8 = local_4d8;
  uVar7 = local_2f8;
  uStack_2f0 = uStack_4d0;
  uVar8 = uStack_2f0;
  local_2e8._0_4_ = auVar20._0_4_;
  local_2e8._4_4_ = auVar20._4_4_;
  uStack_2e0._0_4_ = auVar20._8_4_;
  uStack_2e0._4_4_ = auVar20._12_4_;
  local_2f8._0_4_ = auVar19._0_4_;
  local_2f8._4_4_ = auVar19._4_4_;
  uStack_2f0._0_4_ = auVar19._8_4_;
  uStack_2f0._4_4_ = auVar19._12_4_;
  local_308 = CONCAT44(local_2e8._4_4_ + local_2f8._4_4_,(int)local_2e8 + (int)local_2f8);
  uStack_300 = CONCAT44(uStack_2e0._4_4_ + uStack_2f0._4_4_,(int)uStack_2e0 + (int)uStack_2f0);
  local_388 = CONCAT44(local_2e8._4_4_ + local_2f8._4_4_ + local_1fc,
                       (int)local_2e8 + (int)local_2f8 + local_1fc);
  uStack_380 = CONCAT44(uStack_2e0._4_4_ + uStack_2f0._4_4_ + local_1fc,
                        (int)uStack_2e0 + (int)uStack_2f0 + local_1fc);
  local_38c = local_3a4;
  in0[1] = local_3a0 + 3;
  in1[1] = (longlong)&local_438;
  in1[0] = (longlong)&local_428;
  in0[0] = (longlong)local_3a0;
  local_40c = iVar21;
  local_318 = local_408;
  uStack_310 = uStack_400;
  local_2f8 = uVar7;
  uStack_2f0 = uVar8;
  local_2e8 = uVar9;
  uStack_2e0 = uVar10;
  local_2d8 = local_408;
  uStack_2d0 = uStack_400;
  local_2b8 = uVar11;
  uStack_2b0 = uVar12;
  local_2a8 = uVar13;
  uStack_2a0 = uVar14;
  local_298 = local_408;
  uStack_290 = uStack_400;
  local_278 = local_408;
  uStack_270 = uStack_400;
  local_258 = uVar15;
  uStack_250 = uVar16;
  local_248 = uVar17;
  uStack_240 = uVar18;
  local_1e8 = local_3d8;
  uStack_1e0 = uStack_3d0;
  local_1c8 = local_3e8;
  uStack_1c0 = uStack_3e0;
  local_1a8 = local_3f8;
  uStack_1a0 = uStack_3f0;
  local_198 = local_1d8;
  uStack_190 = uStack_1d0;
  local_188 = local_3d8;
  uStack_180 = uStack_3d0;
  local_178 = local_1b8;
  uStack_170 = uStack_1b0;
  local_168 = local_3c8;
  uStack_160 = uStack_3c0;
  local_148 = local_3c8;
  uStack_140 = uStack_3c0;
  local_128 = local_3c8;
  uStack_120 = uStack_3c0;
  local_118 = local_1ec;
  local_114 = local_1ec;
  local_110 = local_1ec;
  local_10c = local_1ec;
  local_108 = local_3d8;
  uStack_100 = uStack_3d0;
  local_f8 = local_1f0;
  local_f4 = local_1f0;
  local_f0 = local_1f0;
  local_ec = local_1f0;
  local_e8 = local_3e8;
  uStack_e0 = uStack_3e0;
  local_d8 = local_1f4;
  local_d4 = local_1f4;
  local_d0 = local_1f4;
  local_cc = local_1f4;
  local_c8 = local_3f8;
  uStack_c0 = uStack_3f0;
  local_b8 = local_1f8;
  local_b4 = local_1f8;
  local_b0 = local_1f8;
  local_ac = local_1f8;
  local_a8 = local_408;
  uStack_a0 = uStack_400;
  local_98 = local_1fc;
  local_94 = local_1fc;
  local_90 = local_1fc;
  local_8c = local_1fc;
  local_88 = local_428;
  lStack_80 = lStack_420;
  local_78 = local_200;
  local_74 = local_200;
  local_70 = local_200;
  local_6c = local_200;
  local_68 = local_438;
  lStack_60 = lStack_430;
  local_58 = local_204;
  local_54 = local_204;
  local_50 = local_204;
  local_4c = local_204;
  addsub_sse4_1(in0,in1,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_fffffffffffffb18,(__m128i *)CONCAT44(iVar21,in_stack_fffffffffffffb20));
  in0_00[0] = local_3a0 + 1;
  in0_00[1] = local_3a0 + 2;
  in1_00[1] = (longlong)&local_438;
  in1_00[0] = (longlong)&local_428;
  addsub_sse4_1(in0_00,in1_00,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                in_stack_fffffffffffffb18,(__m128i *)CONCAT44(iVar21,in_stack_fffffffffffffb20));
  if (local_3a8 == 0) {
    if (local_3ac + 6 < 0x10) {
      local_40c = 0x10;
    }
    else {
      local_40c = local_3ac + 6;
    }
    local_208 = -(1 << ((char)local_40c - 1U & 0x1f));
    local_428 = CONCAT44(local_208,local_208);
    lStack_420 = CONCAT44(local_208,local_208);
    local_20c = (1 << ((char)local_40c - 1U & 0x1f)) + -1;
    local_438 = CONCAT44(local_20c,local_20c);
    lStack_430 = CONCAT44(local_20c,local_20c);
    local_48 = local_428;
    lStack_40 = lStack_420;
    local_38 = local_208;
    local_34 = local_208;
    local_30 = local_208;
    local_2c = local_208;
    local_28 = local_438;
    lStack_20 = lStack_430;
    local_10 = local_20c;
    local_c = local_20c;
    local_8 = local_20c;
    local_4 = local_20c;
    shift_and_clamp_sse4_1
              (local_3a0,local_3a0 + 3,(__m128i *)&local_428,(__m128i *)&local_438,local_3b0);
    shift_and_clamp_sse4_1
              (local_3a0 + 1,local_3a0 + 2,(__m128i *)&local_428,(__m128i *)&local_438,local_3b0);
  }
  return;
}

Assistant:

static void idct4x4_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                           int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u0, u1, u2, u3;
  __m128i v0, v1, v2, v3, x, y;

  // Stage 0
  // Stage 1
  // Stage 2
  u0 = in[0];
  u1 = in[1];
  u2 = in[2];
  u3 = in[3];

  x = _mm_mullo_epi32(u0, cospi32);
  y = _mm_mullo_epi32(u2, cospi32);
  v0 = _mm_add_epi32(x, y);
  v0 = _mm_add_epi32(v0, rnding);
  v0 = _mm_srai_epi32(v0, bit);

  v1 = _mm_sub_epi32(x, y);
  v1 = _mm_add_epi32(v1, rnding);
  v1 = _mm_srai_epi32(v1, bit);

  x = _mm_mullo_epi32(u1, cospi48);
  y = _mm_mullo_epi32(u3, cospim16);
  v2 = _mm_add_epi32(x, y);
  v2 = _mm_add_epi32(v2, rnding);
  v2 = _mm_srai_epi32(v2, bit);

  x = _mm_mullo_epi32(u1, cospi16);
  y = _mm_mullo_epi32(u3, cospi48);
  v3 = _mm_add_epi32(x, y);
  v3 = _mm_add_epi32(v3, rnding);
  v3 = _mm_srai_epi32(v3, bit);

  // Stage 3
  addsub_sse4_1(v0, v3, out + 0, out + 3, &clamp_lo, &clamp_hi);
  addsub_sse4_1(v1, v2, out + 1, out + 2, &clamp_lo, &clamp_hi);

  if (!do_cols) {
    log_range = AOMMAX(16, bd + 6);
    clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);

    shift_and_clamp_sse4_1(out + 0, out + 3, &clamp_lo, &clamp_hi, out_shift);
    shift_and_clamp_sse4_1(out + 1, out + 2, &clamp_lo, &clamp_hi, out_shift);
  }
}